

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcServiceLife::~IfcServiceLife(IfcServiceLife *this,void **vtt)

{
  void **vtt_local;
  IfcServiceLife *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x1d];
  std::__cxx11::string::~string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>,vtt + 0x17);
  IfcControl::~IfcControl((IfcControl *)this,vtt + 1);
  return;
}

Assistant:

IfcServiceLife() : Object("IfcServiceLife") {}